

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IntersectClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntersectClauseSyntax,slang::parsing::Token,slang::syntax::RangeListSyntax&>
          (BumpAllocator *this,Token *args,RangeListSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  IntersectClauseSyntax *pIVar6;
  
  pIVar6 = (IntersectClauseSyntax *)allocate(this,0x30,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pIVar6->super_SyntaxNode).kind = IntersectClause;
  (pIVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pIVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pIVar6->intersect).kind = TVar2;
  (pIVar6->intersect).field_0x2 = uVar3;
  (pIVar6->intersect).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->intersect).rawLen = uVar5;
  (pIVar6->intersect).info = pIVar1;
  (pIVar6->ranges).ptr = args_1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }